

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O2

message_order * __thiscall
FIX::DataDictionary::getMessageOrderedFields(DataDictionary *this,string *msgType)

{
  const_iterator cVar1;
  message_order *pmVar2;
  ConfigError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FIX::DataDictionary::MessageFieldsOrderHolder>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FIX::DataDictionary::MessageFieldsOrderHolder>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FIX::DataDictionary::MessageFieldsOrderHolder>_>_>
          ::find(&(this->m_messageOrderedFields)._M_t,msgType);
  if ((_Rb_tree_header *)cVar1._M_node !=
      &(this->m_messageOrderedFields)._M_t._M_impl.super__Rb_tree_header) {
    pmVar2 = MessageFieldsOrderHolder::getMessageOrder
                       ((MessageFieldsOrderHolder *)(cVar1._M_node + 2));
    return pmVar2;
  }
  this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
  std::operator+(&bStack_58,"<Message> ",msgType);
  std::operator+(&local_38,&bStack_58," does not have a stored message order");
  ConfigError::ConfigError(this_00,&local_38);
  __cxa_throw(this_00,&ConfigError::typeinfo,Exception::~Exception);
}

Assistant:

EXCEPT(ConfigError) {
  MsgTypeToOrderedFields::const_iterator iter = m_messageOrderedFields.find(msgType);
  if (iter == m_messageOrderedFields.end()) {
    throw ConfigError("<Message> " + msgType + " does not have a stored message order");
  }

  return iter->second.getMessageOrder();
}